

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.hpp
# Opt level: O1

string * limonp::Trim(string *s)

{
  char *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  pointer pcVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  pointer pcVar11;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  sVar3 = s->_M_string_length;
  pcVar11 = pcVar2 + sVar3;
  pcVar7 = pcVar11;
  if (0 < (long)sVar3 >> 2) {
    pcVar7 = pcVar2 + ((uint)sVar3 & 3);
    lVar8 = ((long)sVar3 >> 2) + 1;
    do {
      if ((pcVar11[-1] < '\0') || (iVar6 = isspace((int)pcVar11[-1]), iVar6 == 0))
      goto LAB_00114ed1;
      if ((pcVar11[-2] < '\0') || (iVar6 = isspace((int)pcVar11[-2]), iVar6 == 0)) {
        pcVar11 = pcVar11 + -1;
        goto LAB_00114ed1;
      }
      if ((pcVar11[-3] < '\0') || (iVar6 = isspace((int)pcVar11[-3]), iVar6 == 0)) {
        pcVar11 = pcVar11 + -2;
        goto LAB_00114ed1;
      }
      if ((pcVar11[-4] < '\0') || (iVar6 = isspace((int)pcVar11[-4]), iVar6 == 0)) {
        pcVar11 = pcVar11 + -3;
        goto LAB_00114ed1;
      }
      pcVar11 = pcVar11 + -4;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  lVar8 = (long)pcVar7 - (long)pcVar2;
  if (lVar8 == 1) {
LAB_00114ea5:
    pcVar11 = pcVar7;
    if ((-1 < pcVar7[-1]) && (iVar6 = isspace((int)pcVar7[-1]), iVar6 != 0)) {
      pcVar11 = pcVar2;
    }
  }
  else {
    pcVar11 = pcVar7;
    if (lVar8 == 2) {
LAB_00114e90:
      if ((-1 < pcVar11[-1]) && (iVar6 = isspace((int)pcVar11[-1]), iVar6 != 0)) {
        pcVar7 = pcVar11 + -1;
        goto LAB_00114ea5;
      }
    }
    else {
      pcVar11 = pcVar2;
      if (((lVar8 == 3) && (pcVar11 = pcVar7, -1 < pcVar7[-1])) &&
         (iVar6 = isspace((int)pcVar7[-1]), iVar6 != 0)) {
        pcVar11 = pcVar7 + -1;
        goto LAB_00114e90;
      }
    }
  }
LAB_00114ed1:
  s->_M_string_length = (long)pcVar11 - (long)pcVar2;
  *pcVar11 = '\0';
  pcVar4 = (s->_M_dataplus)._M_p;
  uVar5 = s->_M_string_length;
  pcVar1 = pcVar4 + uVar5;
  pcVar9 = pcVar4;
  if (0 < (long)uVar5 >> 2) {
    pcVar9 = pcVar4 + (uVar5 & 0xfffffffffffffffc);
    lVar8 = ((long)uVar5 >> 2) + 1;
    pcVar10 = pcVar4 + 3;
    do {
      if ((pcVar10[-3] < '\0') || (iVar6 = isspace((int)pcVar10[-3]), iVar6 == 0)) {
        pcVar10 = pcVar10 + -3;
        goto LAB_00114fec;
      }
      if ((pcVar10[-2] < '\0') || (iVar6 = isspace((int)pcVar10[-2]), iVar6 == 0)) {
        pcVar10 = pcVar10 + -2;
        goto LAB_00114fec;
      }
      if ((pcVar10[-1] < '\0') || (iVar6 = isspace((int)pcVar10[-1]), iVar6 == 0)) {
        pcVar10 = pcVar10 + -1;
        goto LAB_00114fec;
      }
      if ((*pcVar10 < '\0') || (iVar6 = isspace((int)*pcVar10), iVar6 == 0)) goto LAB_00114fec;
      lVar8 = lVar8 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar8);
  }
  lVar8 = (long)pcVar1 - (long)pcVar9;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      pcVar10 = pcVar1;
      if (((lVar8 != 3) || (pcVar10 = pcVar9, *pcVar9 < '\0')) ||
         (iVar6 = isspace((int)*pcVar9), iVar6 == 0)) goto LAB_00114fec;
      pcVar9 = pcVar9 + 1;
    }
    pcVar10 = pcVar9;
    if ((*pcVar9 < '\0') || (iVar6 = isspace((int)*pcVar9), iVar6 == 0)) goto LAB_00114fec;
    pcVar9 = pcVar9 + 1;
  }
  pcVar10 = pcVar9;
  if ((-1 < *pcVar9) && (iVar6 = isspace((int)*pcVar9), iVar6 != 0)) {
    pcVar10 = pcVar1;
  }
LAB_00114fec:
  if (pcVar1 == pcVar10) {
    s->_M_string_length = 0;
    *pcVar4 = '\0';
  }
  else {
    std::__cxx11::string::_M_erase((ulong)s,0);
  }
  return s;
}

Assistant:

inline std::string& Trim(std::string &s) {
  return LTrim(RTrim(s));
}